

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

Integer pnga_pgroup_split(Integer grp,Integer grp_num)

{
  Integer *list;
  long grp_00;
  Integer IVar1;
  Integer IVar2;
  long lVar3;
  Integer IVar4;
  long lVar5;
  long count;
  long count_00;
  long lVar6;
  long lVar7;
  
  list = (Integer *)malloc(GAnproc << 3);
  if (grp_num < 0) {
    pnga_error("Invalid argument (number of groups < 0)",grp_num);
  }
  else if (grp_num == 0) {
    return grp;
  }
  grp_00 = (long)GA_Default_Proc_Group;
  pnga_pgroup_set_default(grp);
  IVar1 = pnga_nnodes();
  IVar2 = pnga_nodeid();
  count_00 = (ulong)(grp_num * (IVar1 / grp_num) < IVar1) + IVar1 / grp_num;
  lVar3 = (IVar2 / count_00 + 1) * count_00;
  lVar6 = lVar3 + -1;
  lVar5 = IVar1 + -1;
  if (lVar6 < IVar1 + -1) {
    lVar5 = lVar6;
  }
  if (lVar5 < count_00 * (IVar2 / count_00)) {
    pnga_error("Invalid proc range encountered",0);
  }
  lVar7 = 0;
  lVar6 = 0;
  if (0 < IVar1) {
    lVar6 = IVar1;
  }
  IVar2 = -1;
  count = 0;
  for (; lVar6 != lVar7; lVar7 = lVar7 + 1) {
    if ((lVar7 != 0) && (count % count_00 == 0)) {
      IVar4 = pnga_pgroup_create(list,count_00);
      if (lVar5 + 1 == lVar7) {
        IVar2 = IVar4;
      }
      count = 0;
    }
    list[count] = lVar7;
    count = count + 1;
  }
  IVar4 = pnga_pgroup_create(list,count);
  if (lVar3 < IVar1) {
    IVar4 = IVar2;
  }
  pnga_pgroup_set_default(grp_00);
  if (IVar4 == -1) {
    pnga_error("ga_pgroup_split failed",-1);
  }
  free(list);
  return IVar4;
}

Assistant:

Integer pnga_pgroup_split(Integer grp, Integer grp_num)
{
  Integer nprocs, me, default_grp;
  Integer ratio, start, end, grp_size;
  Integer i, icnt;
  Integer *nodes;
  Integer grp_id, ret=-1;

  /* Allocate temporary array */
  nodes = (Integer*)malloc(GAnproc*sizeof(Integer));

  if(grp_num<0) pnga_error("Invalid argument (number of groups < 0)",grp_num);
  if(grp_num==0) return grp;
  
  default_grp = pnga_pgroup_get_default();
  pnga_pgroup_set_default(grp);
  
#if 0 /* This is wrong. Should split only default group and not world group */
  world_grp = pnga_pgroup_get_world();
  pnga_pgroup_set_default(world_grp);
#endif
  nprocs = pnga_nnodes();
  me = pnga_nodeid();
  /* Figure out how big groups are */
  grp_size = nprocs/grp_num;
  if (nprocs > grp_size*grp_num) grp_size++;
  /* Figure out what procs are in my group */
  ratio = me/grp_size;
  start = ratio*grp_size;
  end = (ratio+1)*grp_size-1;
  end = GA_MIN(end,nprocs-1);
  if (end<start)
    pnga_error("Invalid proc range encountered",0);
  icnt = 0;
  for (i= 0; i<nprocs; i++) {
    if (icnt%grp_size == 0 && i>0) {
      grp_id = pnga_pgroup_create(nodes, grp_size);
      if (i == end + 1) {
        ret = grp_id;
      }
      icnt = 0;
    }
    nodes[icnt] = i;
    icnt++;
  }
  grp_id = pnga_pgroup_create(nodes, icnt);
  if (end == nprocs-1) {
    ret = grp_id;
  }
  pnga_pgroup_set_default(default_grp);
  if(ret==-1) pnga_error("ga_pgroup_split failed",ret);
  /* Free temporary array */
  free(nodes);
  return ret;
}